

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_2misc_narrow(DisasContext_conflict1 *s,_Bool scalar,int opcode,_Bool u,_Bool is_q,
                        int size,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_ptr pTVar1;
  long lVar2;
  TCGContext_conflict1 *pTVar3;
  _Bool is_q_00;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  NeonGenNarrowEnvFn *pNVar6;
  NeonGenNarrowFn *pNVar7;
  uintptr_t o;
  TCGv_i64 tcg_dest;
  ulong uVar8;
  TCGv_i32 ret;
  uint uVar9;
  undefined7 in_register_00000031;
  code *func;
  undefined7 in_register_00000081;
  undefined4 in_register_0000008c;
  TCGArg a3;
  long lVar10;
  uintptr_t o_2;
  TCGv_i32 ret_00;
  bool bVar11;
  TCGv_i32 tcg_res [2];
  TCGTemp *local_b8;
  TCGTemp *local_b0;
  TCGTemp *local_a8;
  ulong local_a0;
  undefined4 local_98;
  MemOp local_94;
  uint local_90;
  int local_8c;
  ulong local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGv_i32 local_60;
  TCGv_i32 local_58;
  NeonGenNarrowEnvFn **local_50;
  long lStack_48;
  TCGv_i32 local_40;
  
  local_a0 = CONCAT44(in_register_0000008c,size);
  local_98 = (undefined4)CONCAT71(in_register_00000081,is_q);
  uVar9 = (uint)CONCAT71(in_register_00000031,scalar);
  uVar8 = CONCAT71(in_register_00000031,scalar) & 0xffffffff;
  tcg_ctx = s->uc->tcg_ctx;
  local_8c = opcode;
  if (uVar9 != 0) {
    local_40 = tcg_const_i32_aarch64(tcg_ctx,0);
  }
  local_94 = (int)local_a0 + MO_16;
  local_88 = local_a0 & 0xffffffff;
  local_50 = handle_2misc_narrow::fns[local_88] + u;
  a3 = (TCGArg)(rn * 0x100 + 0xc10);
  lVar10 = 0;
  local_90 = uVar9;
  do {
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    tcg_dest = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    if ((char)uVar8 == '\0') {
      pTVar3 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar3,INDEX_op_ld_i64,(TCGArg)((long)pTVar3 + (long)tcg_dest),
                          (TCGArg)(pTVar3->cpu_env + (long)pTVar3),a3);
    }
    else {
      read_vec_element(s,tcg_dest,rn,(int)lVar10,local_94);
    }
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    ret_00 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    (&lStack_48)[lVar10] = (long)ret_00;
    if (local_8c < 0x16) {
      if (local_8c != 0x12) {
        if (local_8c != 0x14) {
LAB_006b6b62:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x276e,(char *)0x0);
        }
        pNVar6 = *local_50;
        goto LAB_006b6a56;
      }
      if (u) {
        pNVar6 = handle_2misc_narrow::sqxtunfns[local_88];
        goto LAB_006b6a56;
      }
      pNVar7 = handle_2misc_narrow::xtnfns[local_88];
      pNVar6 = (NeonGenNarrowEnvFn *)0x0;
    }
    else {
      if (local_8c == 0x16) {
        if ((int)local_a0 == 2) {
          pTVar1 = tcg_ctx->cpu_env;
          func = helper_vfp_fcvtsd_aarch64;
          goto LAB_006b68a2;
        }
        local_70 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
        local_58 = (TCGv_i32)((long)local_70 - (long)tcg_ctx);
        local_68 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
        local_60 = (TCGv_i32)((long)local_68 - (long)tcg_ctx);
        local_78 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
        tcg_gen_addi_i64_aarch64
                  (tcg_ctx,(TCGv_i64)((long)local_78 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                   0x2ec8);
        local_80 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
        ret = (TCGv_i32)((long)local_80 - (long)tcg_ctx);
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)local_80,
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x2e6c);
        tcg_gen_extract_i32_aarch64(tcg_ctx,ret,ret,0x1a,1);
        tcg_gen_extr_i64_i32_aarch64(tcg_ctx,local_58,local_60,tcg_dest);
        pTVar4 = local_78;
        local_b8 = local_70;
        local_b0 = local_78;
        local_a8 = local_80;
        tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_fcvt_f32_to_f16_aarch64,local_70,3,&local_b8);
        pTVar5 = local_80;
        local_b8 = local_68;
        local_b0 = pTVar4;
        local_a8 = local_80;
        tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_fcvt_f32_to_f16_aarch64,local_68,3,&local_b8);
        tcg_gen_deposit_i32_aarch64(tcg_ctx,ret_00,local_58,local_60,0x10,0x10);
        tcg_temp_free_internal_aarch64(tcg_ctx,local_70);
        tcg_temp_free_internal_aarch64(tcg_ctx,local_68);
        tcg_temp_free_internal_aarch64(tcg_ctx,local_78);
        tcg_temp_free_internal_aarch64(tcg_ctx,pTVar5);
      }
      else {
        if (local_8c != 0x56) goto LAB_006b6b62;
        if ((int)local_a0 != 2) {
          __assert_fail("size == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x276a,
                        "void handle_2misc_narrow(DisasContext *, _Bool, int, _Bool, _Bool, int, int, int)"
                       );
        }
        pTVar1 = tcg_ctx->cpu_env;
        func = helper_fcvtx_f64_to_f32_aarch64;
LAB_006b68a2:
        local_b0 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
        local_b8 = (TCGTemp *)((long)tcg_ctx + (long)tcg_dest);
        tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)((long)tcg_ctx + (long)ret_00),2,&local_b8);
      }
      pNVar6 = (NeonGenNarrowEnvFn *)0x0;
LAB_006b6a56:
      pNVar7 = (NeonGenNarrowFn *)0x0;
    }
    if (pNVar7 == (NeonGenNarrowFn *)0x0) {
      if (pNVar6 != (NeonGenNarrowEnvFn *)0x0) {
        (*pNVar6)(tcg_ctx,ret_00,tcg_ctx->cpu_env,tcg_dest);
      }
    }
    else {
      (*pNVar7)(tcg_ctx,ret_00,tcg_dest);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    uVar8 = (ulong)local_90;
    if ((char)local_90 != '\0') break;
    a3 = a3 + 8;
    bVar11 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar11);
  is_q_00 = local_98._0_1_;
  uVar8 = (ulong)local_98._0_1_;
  lVar10 = 0;
  do {
    lVar2 = *(long *)((long)&lStack_48 + lVar10 * 2);
    pTVar3 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar3,INDEX_op_st_i32,(long)&pTVar3->pool_cur + lVar2,
                        (TCGArg)(pTVar3->cpu_env + (long)pTVar3),
                        (long)(rd * 0x100 + 0xc00) + uVar8 * 8 + 0x10 + lVar10);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + lVar2));
    lVar10 = lVar10 + 4;
  } while (lVar10 == 4);
  clear_vec_high(s,is_q_00,rd);
  return;
}

Assistant:

static void handle_2misc_narrow(DisasContext *s, bool scalar,
                                int opcode, bool u, bool is_q,
                                int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 2-reg-misc ops which are narrowing (so each 2*size element
     * in the source becomes a size element in the destination).
     */
    int pass;
    TCGv_i32 tcg_res[2];
    int destelt = is_q ? 2 : 0;
    int passes = scalar ? 1 : 2;

    if (scalar) {
        tcg_res[1] = tcg_const_i32(tcg_ctx, 0);
    }

    for (pass = 0; pass < passes; pass++) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        NeonGenNarrowFn *genfn = NULL;
        NeonGenNarrowEnvFn *genenvfn = NULL;

        if (scalar) {
            read_vec_element(s, tcg_op, rn, pass, size + 1);
        } else {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
        }
        tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

        switch (opcode) {
        case 0x12: /* XTN, SQXTUN */
        {
            static NeonGenNarrowFn * const xtnfns[3] = {
                gen_helper_neon_narrow_u8,
                gen_helper_neon_narrow_u16,
                tcg_gen_extrl_i64_i32,
            };
            static NeonGenNarrowEnvFn * const sqxtunfns[3] = {
                gen_helper_neon_unarrow_sat8,
                gen_helper_neon_unarrow_sat16,
                gen_helper_neon_unarrow_sat32,
            };
            if (u) {
                genenvfn = sqxtunfns[size];
            } else {
                genfn = xtnfns[size];
            }
            break;
        }
        case 0x14: /* SQXTN, UQXTN */
        {
            static NeonGenNarrowEnvFn * const fns[3][2] = {
                { gen_helper_neon_narrow_sat_s8,
                  gen_helper_neon_narrow_sat_u8 },
                { gen_helper_neon_narrow_sat_s16,
                  gen_helper_neon_narrow_sat_u16 },
                { gen_helper_neon_narrow_sat_s32,
                  gen_helper_neon_narrow_sat_u32 },
            };
            genenvfn = fns[size][u];
            break;
        }
        case 0x16: /* FCVTN, FCVTN2 */
            /* 32 bit to 16 bit or 64 bit to 32 bit float conversion */
            if (size == 2) {
                gen_helper_vfp_fcvtsd(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            } else {
                TCGv_i32 tcg_lo = tcg_temp_new_i32(tcg_ctx);
                TCGv_i32 tcg_hi = tcg_temp_new_i32(tcg_ctx);
                TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);
                TCGv_i32 ahp = get_ahp_flag(tcg_ctx);

                tcg_gen_extr_i64_i32(tcg_ctx, tcg_lo, tcg_hi, tcg_op);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_lo, tcg_lo, fpst, ahp);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_hi, tcg_hi, fpst, ahp);
                tcg_gen_deposit_i32(tcg_ctx, tcg_res[pass], tcg_lo, tcg_hi, 16, 16);
                tcg_temp_free_i32(tcg_ctx, tcg_lo);
                tcg_temp_free_i32(tcg_ctx, tcg_hi);
                tcg_temp_free_ptr(tcg_ctx, fpst);
                tcg_temp_free_i32(tcg_ctx, ahp);
            }
            break;
        case 0x56:  /* FCVTXN, FCVTXN2 */
            /* 64 bit to 32 bit float conversion
             * with von Neumann rounding (round to odd)
             */
            assert(size == 2);
            gen_helper_fcvtx_f64_to_f32(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            break;
        default:
            g_assert_not_reached();
        }

        if (genfn) {
            genfn(tcg_ctx, tcg_res[pass], tcg_op);
        } else if (genenvfn) {
            genenvfn(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env, tcg_op);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_op);
    }

    for (pass = 0; pass < 2; pass++) {
        write_vec_element_i32(s, tcg_res[pass], rd, destelt + pass, MO_32);
        tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
    }
    clear_vec_high(s, is_q, rd);
}